

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

ostream * tchecker::parsing::operator<<(ostream *os,attr_t *attr)

{
  string *psVar1;
  ostream *poVar2;
  attr_t *attr_local;
  ostream *os_local;
  
  psVar1 = attr_t::key_abi_cxx11_(attr);
  poVar2 = std::operator<<(os,(string *)psVar1);
  poVar2 = std::operator<<(poVar2,": ");
  psVar1 = attr_t::value_abi_cxx11_(attr);
  std::operator<<(poVar2,(string *)psVar1);
  return os;
}

Assistant:

std::ostream & operator<<(std::ostream & os, tchecker::parsing::attr_t const & attr)
{
  os << attr.key() << ": " << attr.value();
  return os;
}